

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

void __thiscall
TasGrid::RuleWavelet::getShiftScale(RuleWavelet *this,int point,double *scale,double *shift)

{
  int iVar1;
  int iVar2;
  double dVar3;
  __type _Var4;
  int subindex;
  int l;
  double *shift_local;
  double *scale_local;
  int point_local;
  RuleWavelet *this_local;
  
  if (point < 3) {
    dVar3 = getNode(this,point);
    *scale = dVar3;
    *shift = -1.0;
  }
  else {
    iVar1 = Maths::intlog2(point + -1);
    iVar2 = (point + -1) % (1 << ((byte)iVar1 & 0x1f));
    _Var4 = ::std::pow<int,int>(2,iVar1 + -2);
    *scale = _Var4;
    if (iVar2 == 0) {
      *shift = -2.0;
    }
    else if (iVar2 == (1 << ((byte)iVar1 & 0x1f)) + -1) {
      *shift = -3.0;
    }
    else {
      *shift = (double)(iVar2 + -1) * 0.5;
    }
  }
  return;
}

Assistant:

void RuleWavelet::getShiftScale(int point, double &scale, double &shift) const{
    if (point < 3){
        scale = getNode(point);
        shift = -1.0;
    }else{
        int l = Maths::intlog2(point - 1);
        int subindex = (point - 1) % (1 << l);
        scale = std::pow(2,l-2);
        if (subindex == 0){
            shift = -2.0;
        }else if (subindex == (1 << l) - 1){
            shift = -3.0;
        }else{
            shift = 0.5 * (double (subindex - 1));
        }
    }
}